

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_api.c
# Opt level: O1

MPP_RET mpg4d_callback(void *dec,void *err_info)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  MPP_RET MVar7;
  RK_U32 RVar8;
  RK_U32 RVar9;
  MppFrame mframe;
  
  if (dec == (void *)0x0 || err_info == (void *)0x0) {
    _mpp_log_l(2,"mpg4d_api","found NULL input dec %p err_info %p\n","mpg4d_callback",dec,err_info);
    MVar7 = MPP_ERR_NULL_PTR;
  }
  else {
    mframe = (MppFrame)0x0;
    lVar5 = *err_info;
    mpp_buf_slot_get_prop(*dec,*(RK_S32 *)(lVar5 + 0x34),SLOT_FRAME_PTR,&mframe);
    if ((mframe != (MppFrame)0x0) &&
       (uVar6 = *(ulong *)(lVar5 + 8), *(int *)((long)err_info + 0x10) != 0 || (uVar6 & 0xc) != 0))
    {
      mpp_frame_set_errinfo(mframe,1);
      uVar1 = *(uint *)((long)dec + 0x3c);
      uVar2 = *(uint *)(lVar5 + 8);
      uVar3 = *(uint *)(lVar5 + 0x34);
      uVar4 = *(uint *)((long)err_info + 0x10);
      RVar8 = mpp_frame_get_errinfo(mframe);
      RVar9 = mpp_frame_get_discard(mframe);
      _mpp_log_l(4,"mpg4d_api",
                 "[CALLBACK] g_no=%d, out_idx=%d, dpberr=%d, harderr=%d, ref_flag=%d, errinfo=%d, discard=%d\n"
                 ,"mpg4d_callback",(ulong)uVar1,(ulong)uVar3,(ulong)((uVar6 & 0xc) != 0),
                 (ulong)uVar4,(ulong)(uVar2 >> 4 & 1),(ulong)RVar8,(ulong)RVar9);
    }
    MVar7 = MPP_OK;
  }
  return MVar7;
}

Assistant:

static MPP_RET mpg4d_callback(void *dec, void *err_info)
{
    Mpg4dCtx *p_Dec = (Mpg4dCtx *)dec;
    DecCbHalDone *ctx = (DecCbHalDone *)err_info;

    if (NULL == dec || NULL == err_info) {
        mpp_err_f("found NULL input dec %p err_info %p\n", dec, err_info);
        return MPP_ERR_NULL_PTR;
    }

    MppFrame mframe = NULL;
    HalDecTask *task_dec = (HalDecTask *)ctx->task;

    mpp_buf_slot_get_prop(p_Dec->frame_slots, task_dec->output, SLOT_FRAME_PTR, &mframe);
    if (mframe) {
        RK_U32 task_err = task_dec->flags.parse_err || task_dec->flags.ref_err;
        if (ctx->hard_err || task_err) {
            mpp_frame_set_errinfo(mframe, MPP_FRAME_ERR_UNKNOW);
            mpp_log_f("[CALLBACK] g_no=%d, out_idx=%d, dpberr=%d, harderr=%d, ref_flag=%d, errinfo=%d, discard=%d\n",
                      p_Dec->frame_count, task_dec->output, task_err, ctx->hard_err, task_dec->flags.used_for_ref,
                      mpp_frame_get_errinfo(mframe), mpp_frame_get_discard(mframe));
        }
    }
    return MPP_OK;
}